

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTestLog.hpp
# Opt level: O3

void __thiscall
tcu::LogShader::LogShader
          (LogShader *this,qpShaderType type,string *source,bool compileOk,string *infoLog)

{
  pointer pcVar1;
  
  this->m_type = type;
  (this->m_source)._M_dataplus._M_p = (pointer)&(this->m_source).field_2;
  pcVar1 = (source->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->m_source,pcVar1,pcVar1 + source->_M_string_length);
  this->m_compileOk = compileOk;
  (this->m_infoLog)._M_dataplus._M_p = (pointer)&(this->m_infoLog).field_2;
  pcVar1 = (infoLog->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->m_infoLog,pcVar1,pcVar1 + infoLog->_M_string_length);
  return;
}

Assistant:

LogShader (qpShaderType type, const std::string& source, bool compileOk, const std::string& infoLog)
		: m_type		(type)
		, m_source		(source)
		, m_compileOk	(compileOk)
		, m_infoLog		(infoLog)
	{
	}